

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

MDD lddmc_makenode(uint32_t value,MDD ifeq,MDD ifneq)

{
  long *plVar1;
  uint64_t a;
  uint64_t b;
  FILE *__stream;
  MDD MVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  int created;
  mddnode n;
  
  MVar2 = ifneq;
  if (ifeq != 0) {
    if (ifneq != 0) {
      if (ifneq == 1) {
        __assert_fail("ifneq != lddmc_true",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0x166,"MDD lddmc_makenode(uint32_t, MDD, MDD)");
      }
      if (*(uint *)(nodes->data + ifneq * 0x10 + 6) <= value) {
        __assert_fail("value < mddnode_getvalue(LDD_GETNODE(ifneq))",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0x167,"MDD lddmc_makenode(uint32_t, MDD, MDD)");
      }
    }
    n.a._0_6_ = (int6)ifneq * 2;
    n.b._2_6_ = (undefined6)((ifeq << 0x11) >> 0x10);
    n.a._6_2_ = (undefined2)value;
    n.b._0_2_ = (undefined2)(value >> 0x10);
    a = CONCAT26(n.a._6_2_,(int6)n.a);
    b = CONCAT62(n.b._2_6_,(undefined2)n.b);
    n._6_4_ = value;
    MVar2 = llmsset_lookup(nodes,a,b,&created);
    if (MVar2 == 0) {
      lddmc_refs_push(ifeq);
      lddmc_refs_push(ifneq);
      sylvan_gc_RUN();
      plVar1 = (long *)(*(long *)(in_FS_OFFSET + -0x20) + 0x28);
      *plVar1 = *plVar1 + -8;
      MVar2 = llmsset_lookup(nodes,a,b,&created);
      __stream = _stderr;
      if (MVar2 == 0) {
        sVar3 = llmsset_count_marked_RUN(nodes);
        fprintf(__stream,"MDD Unique table full, %zu of %zu buckets filled!\n",sVar3,
                nodes->table_size);
        exit(1);
      }
    }
  }
  return MVar2;
}

Assistant:

MDD
lddmc_makenode(uint32_t value, MDD ifeq, MDD ifneq)
{
    if (ifeq == lddmc_false) return ifneq;

    // check if correct (should be false, or next in value)
    assert(ifneq != lddmc_true);
    if (ifneq != lddmc_false) assert(value < mddnode_getvalue(LDD_GETNODE(ifneq)));

    struct mddnode n;
    mddnode_make(&n, value, ifneq, ifeq);

    int created;
    uint64_t index = llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        lddmc_refs_push(ifeq);
        lddmc_refs_push(ifneq);
        RUN(sylvan_gc);
        lddmc_refs_pop(1);

        index = llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) {
            fprintf(stderr, "MDD Unique table full, %zu of %zu buckets filled!\n", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            exit(1);
        }
    }

    if (created) sylvan_stats_count(LDD_NODES_CREATED);
    else sylvan_stats_count(LDD_NODES_REUSED);

    return (MDD)index;
}